

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::_tear_down_invoke(Executor *this,Worker *worker,Node *node,Node **cache)

{
  long lVar1;
  uint *puVar2;
  long *plVar3;
  uint *puVar4;
  long *in_RCX;
  long in_RDX;
  Worker *in_RDI;
  nstate_t state;
  Node *parent;
  Node *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  Topology *in_stack_ffffffffffffffb0;
  Worker *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  puVar2 = *(uint **)(in_RDX + 0x38);
  if (puVar2 == (uint *)0x0) {
    plVar3 = (long *)(*(long *)(in_RDX + 0x30) + 0x60);
    LOCK();
    lVar1 = *plVar3;
    *plVar3 = *plVar3 + -1;
    UNLOCK();
    if (lVar1 == 1) {
      _tear_down_topology((Executor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
  }
  else {
    puVar4 = puVar2 + 0x20;
    LOCK();
    lVar1 = *(long *)puVar4;
    *(long *)puVar4 = *(long *)puVar4 + -1;
    UNLOCK();
    if ((lVar1 == 1) && ((*puVar2 & 0x20000000) != 0)) {
      if (*in_RCX != 0) {
        _schedule((Executor *)CONCAT44(*puVar2,in_stack_ffffffffffffff60),in_RDI,
                  in_stack_ffffffffffffff50);
      }
      *in_RCX = (long)puVar2;
    }
  }
  return;
}

Assistant:

inline void Executor::_tear_down_invoke(Worker& worker, Node* node, Node*& cache) {
  
  // we must check parent first before subtracting the join counter,
  // or it can introduce data race
  if(auto parent = node->_parent; parent == nullptr) {
    if(node->_topology->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      _tear_down_topology(worker, node->_topology);
    }
  }
  else {  
    // needs to fetch every data before join counter becomes zero at which
    // the node may be deleted
    auto state = parent->_nstate;
    if(parent->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      if(state & NSTATE::PREEMPTED) {
        _update_cache(worker, cache, parent);
      }
    }
  }
}